

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qwizard.cpp
# Opt level: O1

void QWizardPage::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined8 *puVar1;
  long lVar2;
  QArrayData *pQVar3;
  byte bVar4;
  int *piVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  
  switch(_c) {
  case InvokeMetaMethod:
    if (_id == 2) {
      lVar2 = *(long *)(_o + 8);
      bVar4 = (**(code **)(**(long **)(lVar2 + 8) + 0x1b8))();
      *(uint *)(lVar2 + 0x308) = (uint)bVar4;
    }
    else if (_id == 1) {
      QWizardPagePrivate::_q_maybeEmitCompleteChanged(*(QWizardPagePrivate **)(_o + 8));
    }
    else if (_id == 0) {
      QMetaObject::activate(_o,&staticMetaObject,0,(void **)0x0);
    }
    if (_c == ReadProperty) goto switchD_0051994a_caseD_1;
    if (_c != WriteProperty) {
      if (_c != IndexOfMethod) {
        return;
      }
      goto switchD_0051994a_caseD_5;
    }
    break;
  case ReadProperty:
switchD_0051994a_caseD_1:
    puVar1 = (undefined8 *)*_a;
    if (_id == 1) {
      lVar2 = *(long *)(_o + 8);
      piVar5 = *(int **)(lVar2 + 0x278);
      uVar6 = *(undefined8 *)(lVar2 + 0x280);
      uVar7 = *(undefined8 *)(lVar2 + 0x288);
LAB_00519a27:
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + 1;
        UNLOCK();
      }
      pQVar3 = (QArrayData *)*puVar1;
      *puVar1 = piVar5;
      puVar1[1] = uVar6;
      puVar1[2] = uVar7;
      if (pQVar3 != (QArrayData *)0x0) {
        LOCK();
        (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar3,2,0x10);
        }
      }
    }
    else if (_id == 0) {
      lVar2 = *(long *)(_o + 8);
      piVar5 = *(int **)(lVar2 + 0x260);
      uVar6 = *(undefined8 *)(lVar2 + 0x268);
      uVar7 = *(undefined8 *)(lVar2 + 0x270);
      goto LAB_00519a27;
    }
    if (_c != WriteProperty) {
      return;
    }
    break;
  case WriteProperty:
    break;
  default:
    goto switchD_0051994a_caseD_3;
  case IndexOfMethod:
switchD_0051994a_caseD_5:
    if ((*_a[1] == completeChanged) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
      return;
    }
    if (_c != WriteProperty) {
      if (_c != ReadProperty) {
        return;
      }
      goto switchD_0051994a_caseD_1;
    }
  }
  if (_id == 1) {
    setSubTitle((QWizardPage *)_o,(QString *)*_a);
    return;
  }
  if (_id == 0) {
    setTitle((QWizardPage *)_o,(QString *)*_a);
    return;
  }
switchD_0051994a_caseD_3:
  return;
}

Assistant:

void QWizardPage::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QWizardPage *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->completeChanged(); break;
        case 1: _t->d_func()->_q_maybeEmitCompleteChanged(); break;
        case 2: _t->d_func()->_q_updateCachedCompleteState(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QWizardPage::*)()>(_a, &QWizardPage::completeChanged, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->title(); break;
        case 1: *reinterpret_cast<QString*>(_v) = _t->subTitle(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setTitle(*reinterpret_cast<QString*>(_v)); break;
        case 1: _t->setSubTitle(*reinterpret_cast<QString*>(_v)); break;
        default: break;
        }
    }
}